

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getShaderFlagStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkShaderStageFlagBits shader,
          bool isDescription)

{
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  ostringstream local_190 [8];
  ostringstream desc;
  bool isDescription_local;
  VkShaderStageFlagBits shader_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  switch((int)this) {
  case 1:
    if ((shader & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      local_1c0 = "vertex_stage";
    }
    else {
      local_1c0 = "vertex stage";
    }
    std::operator<<((ostream *)local_190,local_1c0);
    break;
  case 2:
    if ((shader & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      local_1e0 = "tessellation_control_stage";
    }
    else {
      local_1e0 = "tessellation control stage";
    }
    std::operator<<((ostream *)local_190,local_1e0);
    break;
  default:
    std::operator<<((ostream *)local_190,"unknown shader stage!");
    break;
  case 4:
    if ((shader & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      local_1e8 = "tessellation_evaluation_stage";
    }
    else {
      local_1e8 = "tessellation evaluation stage";
    }
    std::operator<<((ostream *)local_190,local_1e8);
    break;
  case 8:
    if ((shader & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      local_1d0 = "geometry_stage";
    }
    else {
      local_1d0 = "geometry stage";
    }
    std::operator<<((ostream *)local_190,local_1d0);
    break;
  case 0x10:
    if ((shader & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      local_1c8 = "fragment_stage";
    }
    else {
      local_1c8 = "fragment stage";
    }
    std::operator<<((ostream *)local_190,local_1c8);
    break;
  case 0x20:
    if ((shader & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      local_1d8 = "compute_stage";
    }
    else {
      local_1d8 = "compute stage";
    }
    std::operator<<((ostream *)local_190,local_1d8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderFlagStr (const VkShaderStageFlagBits shader,
							  bool                        isDescription)
{
	std::ostringstream desc;
	switch(shader)
	{
		case VK_SHADER_STAGE_VERTEX_BIT:
		{
			desc << ((isDescription) ? "vertex stage" : "vertex_stage");
			break;
		}
		case VK_SHADER_STAGE_FRAGMENT_BIT:
		{
			desc << ((isDescription) ? "fragment stage" : "fragment_stage");
			break;
		}
		case VK_SHADER_STAGE_GEOMETRY_BIT:
		{
			desc << ((isDescription) ? "geometry stage" : "geometry_stage");
			break;
		}
		case VK_SHADER_STAGE_COMPUTE_BIT:
		{
			desc << ((isDescription) ? "compute stage" : "compute_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		{
			desc << ((isDescription) ? "tessellation control stage" : "tessellation_control_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
		{
			desc << ((isDescription) ? "tessellation evaluation stage" : "tessellation_evaluation_stage");
			break;
		}
	  default:
		desc << "unknown shader stage!";
		DE_FATAL("Unknown shader Stage!");
		break;
	};

	return desc.str();
}